

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O2

int Ivy_ManFindBoolCut_rec
              (Ivy_Man_t *p,Ivy_Obj_t *pObj,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVolume,Ivy_Obj_t *pPivot)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Ivy_Obj_t *Entry;
  
  Entry = pObj;
  if (pObj != pPivot) {
    if ((*(uint *)&pObj->field_0x8 & 0x10) != 0) {
      return 0;
    }
    uVar1 = *(uint *)&pObj->field_0x8 & 0xf;
    if (uVar1 == 1) {
      return 0;
    }
    if (uVar1 == 4) {
      return 0;
    }
    if (uVar1 == 7) {
      iVar2 = Ivy_ManFindBoolCut_rec
                        (p,(Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vLeaves,vVolume,
                         pPivot);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_005e87cd;
    }
    if (uVar1 - 7 < 0xfffffffe) {
      __assert_fail("Ivy_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCut.c"
                    ,0xf5,
                    "int Ivy_ManFindBoolCut_rec(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Ivy_Obj_t *)"
                   );
    }
    iVar2 = Ivy_ManFindBoolCut_rec
                      (p,(Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vLeaves,vVolume,
                       pPivot);
    iVar3 = Ivy_ManFindBoolCut_rec
                      (p,(Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vLeaves,vVolume,
                       pPivot);
    if (iVar2 == 0 && iVar3 == 0) {
      return 0;
    }
    if (iVar2 == 0) {
      Vec_PtrPushUnique(vLeaves,(void *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      Vec_PtrPushUnique(vVolume,(void *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    }
    if (iVar3 != 0) goto LAB_005e87cd;
    Vec_PtrPushUnique(vLeaves,(void *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    Entry = (Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    vLeaves = vVolume;
  }
  Vec_PtrPushUnique(vLeaves,Entry);
LAB_005e87cd:
  Vec_PtrPushUnique(vVolume,pObj);
  return 1;
}

Assistant:

int Ivy_ManFindBoolCut_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVolume, Ivy_Obj_t * pPivot )
{
    int RetValue0, RetValue1;
    if ( pObj == pPivot )
    {
        Vec_PtrPushUnique( vLeaves, pObj );
        Vec_PtrPushUnique( vVolume, pObj );
        return 1;        
    }
    if ( pObj->fMarkA )
        return 0;

//    assert( !Ivy_ObjIsCi(pObj) );
    if ( Ivy_ObjIsCi(pObj) )
        return 0;

    if ( Ivy_ObjIsBuf(pObj) )
    {
        RetValue0 = Ivy_ManFindBoolCut_rec( p, Ivy_ObjFanin0(pObj), vLeaves, vVolume, pPivot );
        if ( !RetValue0 )
            return 0;
        Vec_PtrPushUnique( vVolume, pObj );
        return 1;
    }
    assert( Ivy_ObjIsNode(pObj) );
    RetValue0 = Ivy_ManFindBoolCut_rec( p, Ivy_ObjFanin0(pObj), vLeaves, vVolume, pPivot );
    RetValue1 = Ivy_ManFindBoolCut_rec( p, Ivy_ObjFanin1(pObj), vLeaves, vVolume, pPivot );
    if ( !RetValue0 && !RetValue1 )
        return 0;
    // add new leaves
    if ( !RetValue0 )
    {
        Vec_PtrPushUnique( vLeaves, Ivy_ObjFanin0(pObj) );
        Vec_PtrPushUnique( vVolume, Ivy_ObjFanin0(pObj) );
    }
    if ( !RetValue1 )
    {
        Vec_PtrPushUnique( vLeaves, Ivy_ObjFanin1(pObj) );
        Vec_PtrPushUnique( vVolume, Ivy_ObjFanin1(pObj) );
    }
    Vec_PtrPushUnique( vVolume, pObj );
    return 1;
}